

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O2

_Bool monster_can_hear(monster *mon)

{
  wchar_t idx;
  monster *pmVar1;
  heatmap *phVar2;
  wchar_t wVar3;
  
  wVar3 = mon->race->hearing;
  idx = (mon->target).midx;
  if (idx == L'\xffffffff') {
    phVar2 = &cave->noise;
    wVar3 = wVar3 + (player->state).skills[5] / -3;
  }
  else {
    if (idx < L'\x01') {
      return false;
    }
    pmVar1 = cave_monster(cave,idx);
    phVar2 = &pmVar1->noise;
  }
  if (phVar2->grids[(mon->grid).y][(mon->grid).x] == 0) {
    return false;
  }
  return (int)(uint)phVar2->grids[(mon->grid).y][(mon->grid).x] < wVar3;
}

Assistant:

static bool monster_can_hear(struct monster *mon)
{
	int hearing = mon->race->hearing;
	struct heatmap noise_map = { 0 };

	/* Set target info */
	if (mon->target.midx == -1) {
		noise_map = cave->noise;
		hearing -= player->state.skills[SKILL_STEALTH] / 3;
	} else if (mon->target.midx > 0) {
		noise_map = cave_monster(cave, mon->target.midx)->noise;
	} else {
		return false;
	}

	/* Try and hear */
	if (noise_map.grids[mon->grid.y][mon->grid.x] == 0) {
		return false;
	}
	return hearing > noise_map.grids[mon->grid.y][mon->grid.x];
}